

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSetColumnWidthAutoSingle(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *column;
  int column_n_local;
  ImGuiTable *table_local;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  if ((pIVar1->IsVisible & 1U) != 0) {
    pIVar1->CannotSkipItemsQueue = '\x01';
    pIVar1->AutoFitQueue = '\x02';
    if ((pIVar1->Flags & 4U) != 0) {
      table->AutoFitSingleStretchColumn = (ImS8)column_n;
    }
  }
  return;
}

Assistant:

void    ImGui::TableSetColumnWidthAutoSingle(ImGuiTable* table, int column_n)
{
    // Single auto width uses auto-fit
    ImGuiTableColumn* column = &table->Columns[column_n];
    if (!column->IsVisible)
        return;
    column->CannotSkipItemsQueue = (1 << 0);
    column->AutoFitQueue = (1 << 1);
    if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        table->AutoFitSingleStretchColumn = (ImS8)column_n;
}